

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O3

void __thiscall
lf::io::GmshReader::GmshReader
          (GmshReader *this,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *factory,
          GmshFileVariant *msh_file)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined8 *puVar3;
  anon_class_8_1_8991fb9c local_30;
  
  (this->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mesh_factory_)._M_t.
  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (factory->_M_t).
       super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
       _M_t.
       super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
       super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
  (factory->_M_t).
  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
  (this->physical_nrs_).
  super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->physical_nrs_).
  super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = &(this->name_2_nr_)._M_t._M_impl.super__Rb_tree_header;
  (this->name_2_nr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_2_nr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_2_nr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_2_nr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->name_2_nr_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nr_2_name_)._M_t._M_impl.super__Rb_tree_header;
  (this->nr_2_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nr_2_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nr_2_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nr_2_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nr_2_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar2 = (long)(char)(msh_file->super__Variant_base<lf::io::GMshFileV2,_lf::io::GMshFileV4>).
                      super__Move_assign_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
                      super__Copy_assign_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
                      super__Move_ctor_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
                      super__Copy_ctor_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
                      super__Variant_storage_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>._M_index;
  local_30.this = this;
  if (lVar2 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc:27:14)_&&,_const_std::variant<lf::io::GMshFileV2,_lf::io::GMshFileV4>_&>
      ::_S_vtable._M_arr[lVar2]._M_data)(&local_30,msh_file);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = &PTR__exception_003f4518;
  puVar3[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar3,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

GmshReader::GmshReader(std::unique_ptr<mesh::MeshFactory> factory,
                       const GmshFileVariant& msh_file)
    : mesh_factory_(std::move(factory)) {
  std::visit([this](const auto& mf) { InitGmshFile(mf); }, msh_file);
}